

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelf(ExtensionSet *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer ppVar4;
  _Self local_28;
  const_iterator end;
  const_iterator iter;
  int total_size;
  ExtensionSet *this_local;
  
  sVar3 = std::
          map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::size(&this->extensions_);
  iter._M_node._4_4_ = (int)(sVar3 << 5);
  end = std::
        map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
        ::begin(&this->extensions_);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_28);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&end);
    iVar2 = Extension::SpaceUsedExcludingSelf(&ppVar4->second);
    iter._M_node._4_4_ = iVar2 + iter._M_node._4_4_;
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&end);
  }
  return iter._M_node._4_4_;
}

Assistant:

int ExtensionSet::SpaceUsedExcludingSelf() const {
  int total_size =
      extensions_.size() * sizeof(map<int, Extension>::value_type);
  for (map<int, Extension>::const_iterator iter = extensions_.begin(),
       end = extensions_.end();
       iter != end;
       ++iter) {
    total_size += iter->second.SpaceUsedExcludingSelf();
  }
  return total_size;
}